

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logging.cc
# Opt level: O3

string * google::ShellEscape(string *__return_storage_ptr__,string *src)

{
  uint uVar1;
  long lVar2;
  string *psVar3;
  ulong uVar4;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  if ((src->_M_string_length == 0) ||
     (lVar2 = std::__cxx11::string::find_first_not_of((char *)src,0x128320,0), lVar2 != -1)) {
    lVar2 = std::__cxx11::string::find((char)src,0x27);
    if (lVar2 == -1) {
      std::__cxx11::string::_M_replace
                ((ulong)__return_storage_ptr__,0,(char *)__return_storage_ptr__->_M_string_length,
                 0x1297c0);
      std::__cxx11::string::_M_append((char *)__return_storage_ptr__,(ulong)(src->_M_dataplus)._M_p)
      ;
    }
    else {
      std::__cxx11::string::_M_replace
                ((ulong)__return_storage_ptr__,0,(char *)__return_storage_ptr__->_M_string_length,
                 0x127322);
      if (src->_M_string_length != 0) {
        uVar4 = 0;
        do {
          uVar1 = (byte)(src->_M_dataplus)._M_p[uVar4] - 0x22;
          if ((uVar1 < 0x3f) && ((0x4400000000000005U >> ((ulong)uVar1 & 0x3f) & 1) != 0)) {
            std::__cxx11::string::append((char *)__return_storage_ptr__);
          }
          std::__cxx11::string::append((string *)__return_storage_ptr__,(ulong)src,uVar4);
          uVar4 = uVar4 + 1;
        } while (uVar4 < src->_M_string_length);
      }
    }
    psVar3 = (string *)std::__cxx11::string::append((char *)__return_storage_ptr__);
  }
  else {
    psVar3 = (string *)std::__cxx11::string::_M_assign((string *)__return_storage_ptr__);
  }
  return psVar3;
}

Assistant:

static string ShellEscape(const string& src) {
  string result;
  if (!src.empty() &&  // empty string needs quotes
      src.find_first_not_of(kDontNeedShellEscapeChars) == string::npos) {
    // only contains chars that don't need quotes; it's fine
    result.assign(src);
  } else if (src.find_first_of('\'') == string::npos) {
    // no single quotes; just wrap it in single quotes
    result.assign("'");
    result.append(src);
    result.append("'");
  } else {
    // needs double quote escaping
    result.assign("\"");
    for (size_t i = 0; i < src.size(); ++i) {
      switch (src[i]) {
        case '\\':
        case '$':
        case '"':
        case '`':
          result.append("\\");
      }
      result.append(src, i, 1);
    }
    result.append("\"");
  }
  return result;
}